

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void VW::cmd_string_replace_value(stringstream **ss,string *flag_to_replace,string *new_value)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  string *in_RDX;
  string *in_RSI;
  long *in_RDI;
  size_t pos_after_value;
  size_t pos;
  string cmd;
  string local_38 [48];
  long *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::append((char *)in_RSI);
  std::__cxx11::stringstream::str();
  lVar1 = std::__cxx11::string::find(local_38,(ulong)in_RSI);
  if (lVar1 == -1) {
    poVar2 = std::operator<<((ostream *)(*local_8 + 0x10)," ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::operator<<(poVar2,in_RDX);
  }
  else {
    lVar3 = std::__cxx11::string::size();
    uVar4 = lVar3 + lVar1;
    lVar1 = std::__cxx11::string::find((char *)local_38,0x3ff036);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)local_38,uVar4,(string *)(lVar1 - uVar4));
    }
    else {
      std::__cxx11::string::replace((ulong)local_38,uVar4,(string *)(lVar1 - uVar4));
    }
    std::__cxx11::stringstream::str((string *)*local_8);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmd_string_replace_value(std::stringstream*& ss, string flag_to_replace, string new_value)
{
  flag_to_replace.append(
      " ");  // add a space to make sure we obtain the right flag in case 2 flags start with the same set of characters
  string cmd = ss->str();
  size_t pos = cmd.find(flag_to_replace);
  if (pos == string::npos)
    // flag currently not present in command string, so just append it to command string
    *ss << " " << flag_to_replace << new_value;
  else
  {
    // flag is present, need to replace old value with new value

    // compute position after flag_to_replace
    pos += flag_to_replace.size();

    // now pos is position where value starts
    // find position of next space
    size_t pos_after_value = cmd.find(" ", pos);
    if (pos_after_value == string::npos)
    {
      // we reach the end of the string, so replace the all characters after pos by new_value
      cmd.replace(pos, cmd.size() - pos, new_value);
    }
    else
    {
      // replace characters between pos and pos_after_value by new_value
      cmd.replace(pos, pos_after_value - pos, new_value);
    }

    ss->str(cmd);
  }
}